

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O1

void __thiscall Fossilize::FeatureFilter::Impl::init_properties(Impl *this,void *pNext)

{
  int iVar1;
  void *pvVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  VkBaseInStructure *base;
  int *piVar16;
  VkPhysicalDeviceFragmentShadingRatePropertiesKHR *pVVar17;
  VkPhysicalDeviceFloatControlsProperties *pVVar18;
  VulkanProperties *pVVar19;
  byte bVar20;
  
  bVar20 = 0;
  if (pNext != (void *)0x0) {
    do {
      iVar1 = *pNext;
      if (iVar1 < 0x3b9d3eea) {
        if (iVar1 < 0x3b9c3930) {
          switch(iVar1) {
          case 0x32:
            (this->props).subgroup.subgroupSize = *(uint32_t *)((long)pNext + 0x40);
            (this->props).subgroup.supportedStages = *(VkShaderStageFlags *)((long)pNext + 0x44);
            (this->props).subgroup.supportedOperations =
                 *(VkSubgroupFeatureFlags *)((long)pNext + 0x48);
            (this->props).subgroup.quadOperationsInAllStages = *(VkBool32 *)((long)pNext + 0x4c);
            (this->props).multiview.maxMultiviewViewCount = *(uint32_t *)((long)pNext + 0x54);
            (this->props).multiview.maxMultiviewInstanceIndex = *(uint32_t *)((long)pNext + 0x58);
            break;
          case 0x33:
          case 0x35:
          case 0x37:
            break;
          case 0x34:
            (this->props).float_control.denormBehaviorIndependence =
                 *(VkShaderFloatControlsIndependence *)((long)pNext + 0x218);
            (this->props).float_control.roundingModeIndependence =
                 *(VkShaderFloatControlsIndependence *)((long)pNext + 0x21c);
            (this->props).float_control.shaderSignedZeroInfNanPreserveFloat16 =
                 *(VkBool32 *)((long)pNext + 0x220);
            (this->props).float_control.shaderSignedZeroInfNanPreserveFloat32 =
                 *(VkBool32 *)((long)pNext + 0x224);
            (this->props).float_control.shaderSignedZeroInfNanPreserveFloat64 =
                 *(VkBool32 *)((long)pNext + 0x228);
            (this->props).float_control.shaderDenormPreserveFloat16 =
                 *(VkBool32 *)((long)pNext + 0x22c);
            (this->props).float_control.shaderDenormPreserveFloat32 =
                 *(VkBool32 *)((long)pNext + 0x230);
            (this->props).float_control.shaderDenormPreserveFloat64 =
                 *(VkBool32 *)((long)pNext + 0x234);
            (this->props).float_control.shaderDenormFlushToZeroFloat16 =
                 *(VkBool32 *)((long)pNext + 0x238);
            (this->props).float_control.shaderDenormFlushToZeroFloat32 =
                 *(VkBool32 *)((long)pNext + 0x23c);
            (this->props).float_control.shaderDenormFlushToZeroFloat64 =
                 *(VkBool32 *)((long)pNext + 0x240);
            (this->props).float_control.shaderRoundingModeRTEFloat16 =
                 *(VkBool32 *)((long)pNext + 0x244);
            (this->props).float_control.shaderRoundingModeRTEFloat32 =
                 *(VkBool32 *)((long)pNext + 0x248);
            (this->props).float_control.shaderRoundingModeRTEFloat64 =
                 *(VkBool32 *)((long)pNext + 0x24c);
            (this->props).float_control.shaderRoundingModeRTZFloat16 =
                 *(VkBool32 *)((long)pNext + 0x250);
            (this->props).float_control.shaderRoundingModeRTZFloat32 =
                 *(VkBool32 *)((long)pNext + 0x254);
            (this->props).float_control.shaderRoundingModeRTZFloat64 =
                 *(VkBool32 *)((long)pNext + 600);
            (this->props).descriptor_indexing.maxUpdateAfterBindDescriptorsInAllPools =
                 *(uint32_t *)((long)pNext + 0x25c);
            (this->props).descriptor_indexing.shaderUniformBufferArrayNonUniformIndexingNative =
                 *(VkBool32 *)((long)pNext + 0x260);
            (this->props).descriptor_indexing.shaderSampledImageArrayNonUniformIndexingNative =
                 *(VkBool32 *)((long)pNext + 0x264);
            (this->props).descriptor_indexing.shaderStorageBufferArrayNonUniformIndexingNative =
                 *(VkBool32 *)((long)pNext + 0x268);
            (this->props).descriptor_indexing.shaderStorageImageArrayNonUniformIndexingNative =
                 *(VkBool32 *)((long)pNext + 0x26c);
            (this->props).descriptor_indexing.shaderInputAttachmentArrayNonUniformIndexingNative =
                 *(VkBool32 *)((long)pNext + 0x270);
            (this->props).descriptor_indexing.robustBufferAccessUpdateAfterBind =
                 *(VkBool32 *)((long)pNext + 0x274);
            (this->props).descriptor_indexing.quadDivergentImplicitLod =
                 *(VkBool32 *)((long)pNext + 0x278);
            (this->props).descriptor_indexing.maxPerStageDescriptorUpdateAfterBindSamplers =
                 *(uint32_t *)((long)pNext + 0x27c);
            (this->props).descriptor_indexing.maxPerStageDescriptorUpdateAfterBindUniformBuffers =
                 *(uint32_t *)((long)pNext + 0x280);
            (this->props).descriptor_indexing.maxPerStageDescriptorUpdateAfterBindStorageBuffers =
                 *(uint32_t *)((long)pNext + 0x284);
            (this->props).descriptor_indexing.maxPerStageDescriptorUpdateAfterBindSampledImages =
                 *(uint32_t *)((long)pNext + 0x288);
            (this->props).descriptor_indexing.maxPerStageDescriptorUpdateAfterBindStorageImages =
                 *(uint32_t *)((long)pNext + 0x28c);
            (this->props).descriptor_indexing.maxPerStageDescriptorUpdateAfterBindInputAttachments =
                 *(uint32_t *)((long)pNext + 0x290);
            (this->props).descriptor_indexing.maxPerStageUpdateAfterBindResources =
                 *(uint32_t *)((long)pNext + 0x294);
            (this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindSamplers =
                 *(uint32_t *)((long)pNext + 0x298);
            (this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindUniformBuffers =
                 *(uint32_t *)((long)pNext + 0x29c);
            (this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindUniformBuffersDynamic =
                 *(uint32_t *)((long)pNext + 0x2a0);
            (this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindStorageBuffers =
                 *(uint32_t *)((long)pNext + 0x2a4);
            (this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindStorageBuffersDynamic =
                 *(uint32_t *)((long)pNext + 0x2a8);
            (this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindSampledImages =
                 *(uint32_t *)((long)pNext + 0x2ac);
            (this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindStorageImages =
                 *(uint32_t *)((long)pNext + 0x2b0);
            (this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindInputAttachments =
                 *(uint32_t *)((long)pNext + 0x2b4);
            (this->props).ds_resolve.supportedDepthResolveModes =
                 *(VkResolveModeFlags *)((long)pNext + 0x2b8);
            (this->props).ds_resolve.supportedStencilResolveModes =
                 *(VkResolveModeFlags *)((long)pNext + 700);
            (this->props).ds_resolve.independentResolveNone = *(VkBool32 *)((long)pNext + 0x2c0);
            (this->props).ds_resolve.independentResolve = *(VkBool32 *)((long)pNext + 0x2c4);
            break;
          case 0x36:
            (this->props).subgroup_size_control.minSubgroupSize = *(uint32_t *)((long)pNext + 0x10);
            (this->props).subgroup_size_control.maxSubgroupSize = *(uint32_t *)((long)pNext + 0x14);
            (this->props).subgroup_size_control.maxComputeWorkgroupSubgroups =
                 *(uint32_t *)((long)pNext + 0x18);
            (this->props).subgroup_size_control.requiredSubgroupSizeStages =
                 *(VkShaderStageFlags *)((long)pNext + 0x1c);
            (this->props).inline_uniform_block.maxInlineUniformBlockSize =
                 *(uint32_t *)((long)pNext + 0x20);
            (this->props).inline_uniform_block.maxPerStageDescriptorInlineUniformBlocks =
                 *(uint32_t *)((long)pNext + 0x24);
            (this->props).inline_uniform_block.
            maxPerStageDescriptorUpdateAfterBindInlineUniformBlocks =
                 *(uint32_t *)((long)pNext + 0x28);
            (this->props).inline_uniform_block.maxDescriptorSetInlineUniformBlocks =
                 *(uint32_t *)((long)pNext + 0x2c);
            (this->props).inline_uniform_block.maxDescriptorSetUpdateAfterBindInlineUniformBlocks =
                 *(uint32_t *)((long)pNext + 0x30);
            (this->props).vk13.maxInlineUniformTotalSize = *(uint32_t *)((long)pNext + 0x34);
            break;
          case 0x38:
            (this->props).attribute_divisor.maxVertexAttribDivisor =
                 *(uint32_t *)((long)pNext + 0x14);
            (this->props).push_descriptor.maxPushDescriptors = *(uint32_t *)((long)pNext + 0x1c);
            break;
          default:
            if (iVar1 == 0x3b9b990a) {
              iVar1 = *(int *)((long)pNext + 0x14);
              (this->props).multiview.maxMultiviewViewCount = *(int *)((long)pNext + 0x10);
              (this->props).multiview.maxMultiviewInstanceIndex = iVar1;
              iVar1 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              (this->props).multiview.sType = *(int *)((long)pNext + 0);
              *(int *)&(this->props).multiview.field_0x4 = iVar1;
              (this->props).multiview.pNext = pvVar2;
              (this->props).multiview.pNext = (void *)0x0;
            }
            else if (iVar1 == 0x3b9c0280) {
              iVar1 = *(int *)((long)pNext + 0x14);
              (this->props).push_descriptor.maxPushDescriptors = *(int *)((long)pNext + 0x10);
              *(int *)&(this->props).push_descriptor.field_0x14 = iVar1;
              iVar1 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              (this->props).push_descriptor.sType = *(int *)((long)pNext + 0);
              *(int *)&(this->props).push_descriptor.field_0x4 = iVar1;
              (this->props).push_descriptor.pNext = pvVar2;
              (this->props).push_descriptor.pNext = (void *)0x0;
            }
          }
        }
        else if (iVar1 < 0x3b9cf89b) {
          if (iVar1 == 0x3b9c3930) {
            iVar9 = *(int *)((long)pNext + 0);
            iVar10 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            iVar1 = *(int *)((long)pNext + 0x14);
            iVar7 = *(int *)((long)pNext + 0x18);
            iVar8 = *(int *)((long)pNext + 0x1c);
            (this->props).subgroup.subgroupSize = *(int *)((long)pNext + 0x10);
            (this->props).subgroup.supportedStages = iVar1;
            (this->props).subgroup.supportedOperations = iVar7;
            (this->props).subgroup.quadOperationsInAllStages = iVar8;
            (this->props).subgroup.sType = iVar9;
            *(int *)&(this->props).subgroup.field_0x4 = iVar10;
            (this->props).subgroup.pNext = pvVar2;
            (this->props).subgroup.pNext = (void *)0x0;
          }
          else if (iVar1 == 0x3b9ce511) {
            iVar1 = *(int *)((long)pNext + 0x24);
            (this->props).inline_uniform_block.maxDescriptorSetUpdateAfterBindInlineUniformBlocks =
                 *(int *)((long)pNext + 0x20);
            *(int *)&(this->props).inline_uniform_block.field_0x24 = iVar1;
            iVar9 = *(int *)((long)pNext + 0);
            iVar10 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            iVar1 = *(int *)((long)pNext + 0x14);
            iVar7 = *(int *)((long)pNext + 0x18);
            iVar8 = *(int *)((long)pNext + 0x1c);
            (this->props).inline_uniform_block.maxInlineUniformBlockSize =
                 *(int *)((long)pNext + 0x10);
            (this->props).inline_uniform_block.maxPerStageDescriptorInlineUniformBlocks = iVar1;
            (this->props).inline_uniform_block.
            maxPerStageDescriptorUpdateAfterBindInlineUniformBlocks = iVar7;
            (this->props).inline_uniform_block.maxDescriptorSetInlineUniformBlocks = iVar8;
            (this->props).inline_uniform_block.sType = iVar9;
            *(int *)&(this->props).inline_uniform_block.field_0x4 = iVar10;
            (this->props).inline_uniform_block.pNext = pvVar2;
            (this->props).inline_uniform_block.pNext = (void *)0x0;
          }
        }
        else if (iVar1 == 0x3b9cf89b) {
          iVar10 = *(int *)((long)pNext + 0);
          iVar11 = *(int *)((long)pNext + 4);
          pvVar2 = *(void **)((long)pNext + 8);
          iVar8 = *(int *)((long)pNext + 0x10);
          iVar9 = *(int *)((long)pNext + 0x14);
          uVar6 = *(undefined8 *)((long)pNext + 0x18);
          iVar1 = *(int *)((long)pNext + 0x28);
          iVar7 = *(int *)((long)pNext + 0x2c);
          *(undefined8 *)((this->props).sample_locations.sampleLocationCoordinateRange + 1) =
               *(undefined8 *)((long)pNext + 0x20);
          (this->props).sample_locations.variableSampleLocations = iVar1;
          *(int *)&(this->props).sample_locations.field_0x2c = iVar7;
          (this->props).sample_locations.sampleLocationSampleCounts = iVar8;
          (this->props).sample_locations.maxSampleLocationGridSize.width = iVar9;
          *(undefined8 *)&(this->props).sample_locations.maxSampleLocationGridSize.height = uVar6;
          (this->props).sample_locations.sType = iVar10;
          *(int *)&(this->props).sample_locations.field_0x4 = iVar11;
          (this->props).sample_locations.pNext = pvVar2;
          (this->props).sample_locations.pNext = (void *)0x0;
        }
        else if (iVar1 == 0x3b9d0c21) {
          iVar1 = *(int *)((long)pNext + 0x24);
          (this->props).blend_operation_advanced.advancedBlendCorrelatedOverlap =
               *(int *)((long)pNext + 0x20);
          (this->props).blend_operation_advanced.advancedBlendAllOperations = iVar1;
          iVar9 = *(int *)((long)pNext + 0);
          iVar10 = *(int *)((long)pNext + 4);
          pvVar2 = *(void **)((long)pNext + 8);
          iVar1 = *(int *)((long)pNext + 0x14);
          iVar7 = *(int *)((long)pNext + 0x18);
          iVar8 = *(int *)((long)pNext + 0x1c);
          (this->props).blend_operation_advanced.advancedBlendMaxColorAttachments =
               *(int *)((long)pNext + 0x10);
          (this->props).blend_operation_advanced.advancedBlendIndependentBlend = iVar1;
          (this->props).blend_operation_advanced.advancedBlendNonPremultipliedSrcColor = iVar7;
          (this->props).blend_operation_advanced.advancedBlendNonPremultipliedDstColor = iVar8;
          (this->props).blend_operation_advanced.sType = iVar9;
          *(int *)&(this->props).blend_operation_advanced.field_0x4 = iVar10;
          (this->props).blend_operation_advanced.pNext = pvVar2;
          (this->props).blend_operation_advanced.pNext = (void *)0x0;
        }
        else if (iVar1 == 0x3b9d13fe) {
          iVar11 = *(int *)((long)pNext + 0);
          iVar12 = *(int *)((long)pNext + 4);
          pvVar2 = *(void **)((long)pNext + 8);
          uVar3 = *(uint64_t *)((long)pNext + 0x10);
          uVar4 = *(uint64_t *)((long)pNext + 0x18);
          uVar5 = *(uint64_t *)((long)pNext + 0x20);
          iVar9 = *(int *)((long)pNext + 0x28);
          iVar10 = *(int *)((long)pNext + 0x2c);
          iVar1 = *(int *)((long)pNext + 0x34);
          iVar7 = *(int *)((long)pNext + 0x38);
          iVar8 = *(int *)((long)pNext + 0x3c);
          (this->props).acceleration_structure.maxDescriptorSetAccelerationStructures =
               *(int *)((long)pNext + 0x30);
          (this->props).acceleration_structure.maxDescriptorSetUpdateAfterBindAccelerationStructures
               = iVar1;
          (this->props).acceleration_structure.minAccelerationStructureScratchOffsetAlignment =
               iVar7;
          *(int *)&(this->props).acceleration_structure.field_0x3c = iVar8;
          (this->props).acceleration_structure.maxPrimitiveCount = uVar5;
          (this->props).acceleration_structure.maxPerStageDescriptorAccelerationStructures = iVar9;
          (this->props).acceleration_structure.
          maxPerStageDescriptorUpdateAfterBindAccelerationStructures = iVar10;
          (this->props).acceleration_structure.maxGeometryCount = uVar3;
          (this->props).acceleration_structure.maxInstanceCount = uVar4;
          (this->props).acceleration_structure.sType = iVar11;
          *(int *)&(this->props).acceleration_structure.field_0x4 = iVar12;
          (this->props).acceleration_structure.pNext = pvVar2;
          (this->props).acceleration_structure.pNext = (void *)0x0;
        }
      }
      else if (iVar1 < 0x3b9fcb41) {
        if (iVar1 < 0x3b9dd358) {
          if (iVar1 == 0x3b9d3eea) {
            piVar16 = (int *)pNext;
            pVVar19 = &this->props;
            for (lVar15 = 0xe; lVar15 != 0; lVar15 = lVar15 + -1) {
              iVar1 = piVar16[1];
              (pVVar19->descriptor_indexing).sType = piVar16[0];
              *(int *)&(pVVar19->descriptor_indexing).field_0x4 = iVar1;
              piVar16 = piVar16 + (ulong)bVar20 * -4 + 2;
              pVVar19 = (VulkanProperties *)((long)pVVar19 + (ulong)bVar20 * -0x10 + 8);
            }
            (this->props).descriptor_indexing.pNext = (void *)0x0;
          }
          else if (iVar1 == 0x3b9dcb88) {
            piVar16 = (int *)pNext;
            pVVar18 = &(this->props).float_control;
            for (lVar15 = 0xb; lVar15 != 0; lVar15 = lVar15 + -1) {
              iVar1 = piVar16[1];
              pVVar18->sType = piVar16[0];
              *(int *)&pVVar18->field_0x4 = iVar1;
              piVar16 = piVar16 + (ulong)bVar20 * -4 + 2;
              pVVar18 = (VkPhysicalDeviceFloatControlsProperties *)
                        ((long)pVVar18 + (ulong)bVar20 * -0x10 + 8);
            }
            (this->props).float_control.pNext = (void *)0x0;
          }
        }
        else if (iVar1 == 0x3b9dd358) {
          iVar9 = *(int *)((long)pNext + 0);
          iVar10 = *(int *)((long)pNext + 4);
          pvVar2 = *(void **)((long)pNext + 8);
          iVar1 = *(int *)((long)pNext + 0x14);
          iVar7 = *(int *)((long)pNext + 0x18);
          iVar8 = *(int *)((long)pNext + 0x1c);
          (this->props).ds_resolve.supportedDepthResolveModes = *(int *)((long)pNext + 0x10);
          (this->props).ds_resolve.supportedStencilResolveModes = iVar1;
          (this->props).ds_resolve.independentResolveNone = iVar7;
          (this->props).ds_resolve.independentResolve = iVar8;
          (this->props).ds_resolve.sType = iVar9;
          *(int *)&(this->props).ds_resolve.field_0x4 = iVar10;
          (this->props).ds_resolve.pNext = pvVar2;
          (this->props).ds_resolve.pNext = (void *)0x0;
        }
        else if (iVar1 == 0x3b9e38e8) {
          iVar9 = *(int *)((long)pNext + 0);
          iVar10 = *(int *)((long)pNext + 4);
          pvVar2 = *(void **)((long)pNext + 8);
          iVar1 = *(int *)((long)pNext + 0x14);
          iVar7 = *(int *)((long)pNext + 0x18);
          iVar8 = *(int *)((long)pNext + 0x1c);
          (this->props).subgroup_size_control.minSubgroupSize = *(int *)((long)pNext + 0x10);
          (this->props).subgroup_size_control.maxSubgroupSize = iVar1;
          (this->props).subgroup_size_control.maxComputeWorkgroupSubgroups = iVar7;
          (this->props).subgroup_size_control.requiredSubgroupSizeStages = iVar8;
          (this->props).subgroup_size_control.sType = iVar9;
          *(int *)&(this->props).subgroup_size_control.field_0x4 = iVar10;
          (this->props).subgroup_size_control.pNext = pvVar2;
          (this->props).subgroup_size_control.pNext = (void *)0x0;
        }
        else if (iVar1 == 0x3b9e3cd2) {
          piVar16 = (int *)pNext;
          pVVar17 = &(this->props).fragment_shading_rate;
          for (lVar15 = 0xc; lVar15 != 0; lVar15 = lVar15 + -1) {
            iVar1 = piVar16[1];
            pVVar17->sType = piVar16[0];
            *(int *)&pVVar17->field_0x4 = iVar1;
            piVar16 = piVar16 + (ulong)bVar20 * -4 + 2;
            pVVar17 = (VkPhysicalDeviceFragmentShadingRatePropertiesKHR *)
                      ((long)pVVar17 + (ulong)bVar20 * -0x10 + 8);
          }
          (this->props).fragment_shading_rate.pNext = (void *)0x0;
        }
      }
      else if (iVar1 < 0x3ba1d6b1) {
        if (iVar1 == 0x3b9fcb41) {
          memcpy(&(this->props).mesh_shader,pNext,0xa0);
          (this->props).mesh_shader.pNext = (void *)0x0;
        }
        else if (iVar1 == 0x3ba01579) {
          iVar13 = *(int *)((long)pNext + 0);
          iVar14 = *(int *)((long)pNext + 4);
          pvVar2 = *(void **)((long)pNext + 8);
          iVar9 = *(int *)((long)pNext + 0x10);
          iVar10 = *(int *)((long)pNext + 0x14);
          iVar11 = *(int *)((long)pNext + 0x18);
          iVar12 = *(int *)((long)pNext + 0x1c);
          iVar1 = *(int *)((long)pNext + 0x24);
          iVar7 = *(int *)((long)pNext + 0x28);
          iVar8 = *(int *)((long)pNext + 0x2c);
          (this->props).ray_tracing_pipeline.shaderGroupHandleCaptureReplaySize =
               *(int *)((long)pNext + 0x20);
          (this->props).ray_tracing_pipeline.maxRayDispatchInvocationCount = iVar1;
          (this->props).ray_tracing_pipeline.shaderGroupHandleAlignment = iVar7;
          (this->props).ray_tracing_pipeline.maxRayHitAttributeSize = iVar8;
          (this->props).ray_tracing_pipeline.shaderGroupHandleSize = iVar9;
          (this->props).ray_tracing_pipeline.maxRayRecursionDepth = iVar10;
          (this->props).ray_tracing_pipeline.maxShaderGroupStride = iVar11;
          (this->props).ray_tracing_pipeline.shaderGroupBaseAlignment = iVar12;
          (this->props).ray_tracing_pipeline.sType = iVar13;
          *(int *)&(this->props).ray_tracing_pipeline.field_0x4 = iVar14;
          (this->props).ray_tracing_pipeline.pNext = pvVar2;
          (this->props).ray_tracing_pipeline.pNext = (void *)0x0;
        }
        else if (iVar1 == 0x3ba1bb59) {
          iVar1 = *(int *)((long)pNext + 0x14);
          (this->props).extended_dynamic_state3.dynamicPrimitiveTopologyUnrestricted =
               *(int *)((long)pNext + 0x10);
          *(int *)&(this->props).extended_dynamic_state3.field_0x14 = iVar1;
          iVar1 = *(int *)((long)pNext + 4);
          pvVar2 = *(void **)((long)pNext + 8);
          (this->props).extended_dynamic_state3.sType = *(int *)((long)pNext + 0);
          *(int *)&(this->props).extended_dynamic_state3.field_0x4 = iVar1;
          (this->props).extended_dynamic_state3.pNext = pvVar2;
          (this->props).extended_dynamic_state3.pNext = (void *)0x0;
        }
      }
      else if (iVar1 == 0x3ba1d6b1) {
        iVar1 = *(int *)((long)pNext + 0);
        iVar7 = *(int *)((long)pNext + 4);
        pvVar2 = *(void **)((long)pNext + 8);
        uVar6 = *(undefined8 *)((long)pNext + 0x18);
        *(undefined8 *)(this->props).shader_module_identifier.shaderModuleIdentifierAlgorithmUUID =
             *(undefined8 *)((long)pNext + 0x10);
        *(undefined8 *)
         ((this->props).shader_module_identifier.shaderModuleIdentifierAlgorithmUUID + 8) = uVar6;
        (this->props).shader_module_identifier.sType = iVar1;
        *(int *)&(this->props).shader_module_identifier.field_0x4 = iVar7;
        (this->props).shader_module_identifier.pNext = pvVar2;
        (this->props).shader_module_identifier.pNext = (void *)0x0;
      }
      else if (iVar1 == 0x3ba2ccc8) {
        iVar1 = *(int *)((long)pNext + 0x14);
        (this->props).attribute_divisor.maxVertexAttribDivisor = *(int *)((long)pNext + 0x10);
        (this->props).attribute_divisor.supportsNonZeroFirstInstance = iVar1;
        iVar1 = *(int *)((long)pNext + 4);
        pvVar2 = *(void **)((long)pNext + 8);
        (this->props).attribute_divisor.sType = *(int *)((long)pNext + 0);
        *(int *)&(this->props).attribute_divisor.field_0x4 = iVar1;
        (this->props).attribute_divisor.pNext = pvVar2;
        (this->props).attribute_divisor.pNext = (void *)0x0;
      }
      else if (iVar1 == 0x3ba35d51) {
        iVar13 = *(int *)((long)pNext + 0);
        iVar14 = *(int *)((long)pNext + 4);
        pvVar2 = *(void **)((long)pNext + 8);
        iVar9 = *(int *)((long)pNext + 0x10);
        iVar10 = *(int *)((long)pNext + 0x14);
        iVar11 = *(int *)((long)pNext + 0x18);
        iVar12 = *(int *)((long)pNext + 0x1c);
        iVar1 = *(int *)((long)pNext + 0x24);
        iVar7 = *(int *)((long)pNext + 0x28);
        iVar8 = *(int *)((long)pNext + 0x2c);
        (this->props).maintenance7.maxDescriptorSetTotalBuffersDynamic =
             *(int *)((long)pNext + 0x20);
        (this->props).maintenance7.maxDescriptorSetUpdateAfterBindTotalUniformBuffersDynamic = iVar1
        ;
        (this->props).maintenance7.maxDescriptorSetUpdateAfterBindTotalStorageBuffersDynamic = iVar7
        ;
        (this->props).maintenance7.maxDescriptorSetUpdateAfterBindTotalBuffersDynamic = iVar8;
        (this->props).maintenance7.robustFragmentShadingRateAttachmentAccess = iVar9;
        (this->props).maintenance7.separateDepthStencilAttachmentAccess = iVar10;
        (this->props).maintenance7.maxDescriptorSetTotalUniformBuffersDynamic = iVar11;
        (this->props).maintenance7.maxDescriptorSetTotalStorageBuffersDynamic = iVar12;
        (this->props).maintenance7.sType = iVar13;
        *(int *)&(this->props).maintenance7.field_0x4 = iVar14;
        (this->props).maintenance7.pNext = pvVar2;
        (this->props).maintenance7.pNext = (void *)0x0;
      }
      pNext = *(void **)((long)pNext + 8);
    } while ((int *)pNext != (int *)0x0);
  }
  return;
}

Assistant:

void FeatureFilter::Impl::init_properties(const void *pNext)
{
	while (pNext)
	{
		auto *base = static_cast<const VkBaseInStructure *>(pNext);

#define P(struct_type, member, ...) case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_##struct_type##_PROPERTIES: \
		memcpy(&props.member, base, sizeof(props.member)); \
		props.member.pNext = nullptr; \
		break

#define P_CORE(struct_type, member, ...) P(struct_type, member, __VA_ARGS__)

#define PE(struct_type, member, ext) case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_##struct_type##_PROPERTIES_##ext: \
		memcpy(&props.member, base, sizeof(props.member)); \
		props.member.pNext = nullptr; \
		break

#define PE_ALIAS(struct_type, member, ext, ext_alias) case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_##struct_type##_PROPERTIES_##ext: \
		memcpy(&props.member, base, sizeof(props.member)); \
		props.member.pNext = nullptr; \
		break

#define PROP(struct_name, core_struct, prop) props.struct_name.prop = core_struct.prop
		switch (base->sType)
		{
#include "fossilize_feature_filter_properties.inc"

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_1_PROPERTIES:
		{
			auto &vk11 = *reinterpret_cast<const VkPhysicalDeviceVulkan11Properties *>(base);
			PROP(subgroup, vk11, subgroupSize);
			props.subgroup.supportedStages = vk11.subgroupSupportedStages;
			props.subgroup.supportedOperations = vk11.subgroupSupportedOperations;
			props.subgroup.quadOperationsInAllStages = vk11.subgroupQuadOperationsInAllStages;
			//pointClippingBehavior;
			PROP(multiview, vk11, maxMultiviewViewCount);
			PROP(multiview, vk11, maxMultiviewInstanceIndex);
			//protectedNoFault;
			//maxPerSetDescriptors;
			//maxMemoryAllocationSize;
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_PROPERTIES:
		{
			auto &vk12 = *reinterpret_cast<const VkPhysicalDeviceVulkan12Properties *>(base);
			//conformanceVersion;
			PROP(float_control, vk12, denormBehaviorIndependence);
			PROP(float_control, vk12, roundingModeIndependence);
			PROP(float_control, vk12, shaderSignedZeroInfNanPreserveFloat16);
			PROP(float_control, vk12, shaderSignedZeroInfNanPreserveFloat32);
			PROP(float_control, vk12, shaderSignedZeroInfNanPreserveFloat64);
			PROP(float_control, vk12, shaderDenormPreserveFloat16);
			PROP(float_control, vk12, shaderDenormPreserveFloat32);
			PROP(float_control, vk12, shaderDenormPreserveFloat64);
			PROP(float_control, vk12, shaderDenormFlushToZeroFloat16);
			PROP(float_control, vk12, shaderDenormFlushToZeroFloat32);
			PROP(float_control, vk12, shaderDenormFlushToZeroFloat64);
			PROP(float_control, vk12, shaderRoundingModeRTEFloat16);
			PROP(float_control, vk12, shaderRoundingModeRTEFloat32);
			PROP(float_control, vk12, shaderRoundingModeRTEFloat64);
			PROP(float_control, vk12, shaderRoundingModeRTZFloat16);
			PROP(float_control, vk12, shaderRoundingModeRTZFloat32);
			PROP(float_control, vk12, shaderRoundingModeRTZFloat64);
			PROP(descriptor_indexing, vk12, maxUpdateAfterBindDescriptorsInAllPools);
			PROP(descriptor_indexing, vk12, shaderUniformBufferArrayNonUniformIndexingNative);
			PROP(descriptor_indexing, vk12, shaderSampledImageArrayNonUniformIndexingNative);
			PROP(descriptor_indexing, vk12, shaderStorageBufferArrayNonUniformIndexingNative);
			PROP(descriptor_indexing, vk12, shaderStorageImageArrayNonUniformIndexingNative);
			PROP(descriptor_indexing, vk12, shaderInputAttachmentArrayNonUniformIndexingNative);
			PROP(descriptor_indexing, vk12, robustBufferAccessUpdateAfterBind);
			PROP(descriptor_indexing, vk12, quadDivergentImplicitLod);
			PROP(descriptor_indexing, vk12, maxPerStageDescriptorUpdateAfterBindSamplers);
			PROP(descriptor_indexing, vk12, maxPerStageDescriptorUpdateAfterBindUniformBuffers);
			PROP(descriptor_indexing, vk12, maxPerStageDescriptorUpdateAfterBindStorageBuffers);
			PROP(descriptor_indexing, vk12, maxPerStageDescriptorUpdateAfterBindSampledImages);
			PROP(descriptor_indexing, vk12, maxPerStageDescriptorUpdateAfterBindStorageImages);
			PROP(descriptor_indexing, vk12, maxPerStageDescriptorUpdateAfterBindInputAttachments);
			PROP(descriptor_indexing, vk12, maxPerStageUpdateAfterBindResources);
			PROP(descriptor_indexing, vk12, maxDescriptorSetUpdateAfterBindSamplers);
			PROP(descriptor_indexing, vk12, maxDescriptorSetUpdateAfterBindUniformBuffers);
			PROP(descriptor_indexing, vk12, maxDescriptorSetUpdateAfterBindUniformBuffersDynamic);
			PROP(descriptor_indexing, vk12, maxDescriptorSetUpdateAfterBindStorageBuffers);
			PROP(descriptor_indexing, vk12, maxDescriptorSetUpdateAfterBindStorageBuffersDynamic);
			PROP(descriptor_indexing, vk12, maxDescriptorSetUpdateAfterBindSampledImages);
			PROP(descriptor_indexing, vk12, maxDescriptorSetUpdateAfterBindStorageImages);
			PROP(descriptor_indexing, vk12, maxDescriptorSetUpdateAfterBindInputAttachments);
			PROP(ds_resolve, vk12, supportedDepthResolveModes);
			PROP(ds_resolve, vk12, supportedStencilResolveModes);
			PROP(ds_resolve, vk12, independentResolveNone);
			PROP(ds_resolve, vk12, independentResolve);
			//filterMinmaxSingleComponentFormats;
			//filterMinmaxImageComponentMapping;
			//maxTimelineSemaphoreValueDifference;
			//framebufferIntegerColorSampleCounts;
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_3_PROPERTIES:
		{
			auto &vk13 = *reinterpret_cast<const VkPhysicalDeviceVulkan13Properties *>(base);
			PROP(subgroup_size_control, vk13, minSubgroupSize);
			PROP(subgroup_size_control, vk13, maxSubgroupSize);
			PROP(subgroup_size_control, vk13, maxComputeWorkgroupSubgroups);
			PROP(subgroup_size_control, vk13, requiredSubgroupSizeStages);
			PROP(inline_uniform_block, vk13, maxInlineUniformBlockSize);
			PROP(inline_uniform_block, vk13, maxPerStageDescriptorInlineUniformBlocks);
			PROP(inline_uniform_block, vk13, maxPerStageDescriptorUpdateAfterBindInlineUniformBlocks);
			PROP(inline_uniform_block, vk13, maxDescriptorSetInlineUniformBlocks);
			PROP(inline_uniform_block, vk13, maxDescriptorSetUpdateAfterBindInlineUniformBlocks);
			PROP(vk13, vk13, maxInlineUniformTotalSize);
			// integer dot product hints
			//storageTexelBufferOffsetAlignmentBytes;
			//storageTexelBufferOffsetSingleTexelAlignment;
			//uniformTexelBufferOffsetAlignmentBytes;
			//uniformTexelBufferOffsetSingleTexelAlignment;
			//maxBufferSize;
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_4_PROPERTIES:
		{
			auto &vk14 = *reinterpret_cast<const VkPhysicalDeviceVulkan14Properties *>(base);
			PROP(attribute_divisor, vk14, maxVertexAttribDivisor);
			PROP(push_descriptor, vk14, maxPushDescriptors);
			break;
		}

		default:
			break;
		}

#undef P
#undef PE
#undef PE_ALIAS
#undef PROP

		pNext = base->pNext;
	}
}